

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O1

int AF_AWeapon_CheckAmmo
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  VMValue *pVVar1;
  VMValue *pVVar2;
  AWeapon *this;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  PClass *pPVar5;
  VMValue *pVVar6;
  char *pcVar7;
  bool bVar8;
  
  pPVar3 = AWeapon::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar7 = "(paramnum) < numparam";
  }
  else {
    if (((param->field_0).field_3.Type == '\x03') &&
       (((param->field_0).field_1.atag == 1 || ((param->field_0).field_1.a == (void *)0x0)))) {
      this = (AWeapon *)(param->field_0).field_1.a;
      if (this != (AWeapon *)0x0) {
        if ((this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
            Class == (PClass *)0x0) {
          iVar4 = (**(this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                     super_DObject._vptr_DObject)(this);
          (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.super_DObject.
          Class = (PClass *)CONCAT44(extraout_var,iVar4);
        }
        pPVar5 = (this->super_AStateProvider).super_AInventory.super_AActor.super_DThinker.
                 super_DObject.Class;
        bVar8 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar8) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar8 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar8) {
          pcVar7 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AWeapon))";
          goto LAB_004b0fff;
        }
      }
      if (numparam == 1) {
        pcVar7 = "(paramnum) < numparam";
      }
      else {
        if (param[1].field_0.field_3.Type == '\0') {
          if (numparam < 3) {
            pcVar7 = "(paramnum) < numparam";
          }
          else {
            if (param[2].field_0.field_3.Type == '\0') {
              pVVar1 = param + 1;
              pVVar2 = param + 2;
              if (numparam == 3) {
                pVVar6 = defaultparam->Array;
                if (defaultparam->Array[3].field_0.field_3.Type != '\0') {
                  pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
LAB_004b105c:
                  __assert_fail(pcVar7,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                                ,0x2b1,
                                "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              else {
                pVVar6 = param;
                if (param[3].field_0.field_3.Type != '\0') {
                  pcVar7 = "(param[paramnum]).Type == REGT_INT";
                  goto LAB_004b105c;
                }
              }
              if (numparam < 5) {
                param = defaultparam->Array;
                if (param[4].field_0.field_3.Type == '\0') goto LAB_004b0f44;
                pcVar7 = "(defaultparam[paramnum]).Type == REGT_INT";
              }
              else {
                if (param[4].field_0.field_3.Type == '\0') {
LAB_004b0f44:
                  bVar8 = AWeapon::CheckAmmo(this,(pVVar1->field_0).i,(pVVar2->field_0).i != 0,
                                             pVVar6[3].field_0.i != 0,param[4].field_0.i);
                  if (numret < 1) {
                    iVar4 = 0;
                  }
                  else {
                    if (ret == (VMReturn *)0x0) {
                      __assert_fail("ret != NULL",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                                    ,0x2b3,
                                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                   );
                    }
                    if (ret->RegType != '\0') {
                      __assert_fail("RegType == REGT_INT",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/vm/vm.h"
                                    ,0x13f,"void VMReturn::SetInt(int)");
                    }
                    *(uint *)ret->Location = (uint)bVar8;
                    iVar4 = 1;
                  }
                  return iVar4;
                }
                pcVar7 = "(param[paramnum]).Type == REGT_INT";
              }
              __assert_fail(pcVar7,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                            ,0x2b2,
                            "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                           );
            }
            pcVar7 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar7,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                        ,0x2b0,
                        "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar7 = "param[paramnum].Type == REGT_INT";
      }
      __assert_fail(pcVar7,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x2af,
                    "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
    }
    pcVar7 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
  }
LAB_004b0fff:
  __assert_fail(pcVar7,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                ,0x2ae,
                "int AF_AWeapon_CheckAmmo(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, CheckAmmo)
{
	PARAM_SELF_PROLOGUE(AWeapon);
	PARAM_INT(mode);
	PARAM_BOOL(autoswitch);
	PARAM_BOOL_DEF(require);
	PARAM_INT_DEF(ammocnt);
	ACTION_RETURN_BOOL(self->CheckAmmo(mode, autoswitch, require, ammocnt));
}